

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_block_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LocalSingleBlockLoadStoreElimPass::HasOnlySupportedRefs
          (LocalSingleBlockLoadStoreElimPass *this,uint32_t ptrId)

{
  bool bVar1;
  iterator iVar2;
  DefUseManager *this_00;
  bool bVar3;
  uint32_t ptrId_local;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  ptrId_local = ptrId;
  iVar2 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->supported_ref_ptrs_)._M_h,&ptrId_local);
  bVar3 = true;
  if (iVar2.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/local_single_block_elim_pass.cpp:33:47)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/local_single_block_elim_pass.cpp:33:47)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    bVar1 = analysis::DefUseManager::WhileEachUser
                      (this_00,ptrId_local,
                       (function<bool_(spvtools::opt::Instruction_*)> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (bVar1) {
      std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this->supported_ref_ptrs_,&ptrId_local);
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool LocalSingleBlockLoadStoreElimPass::HasOnlySupportedRefs(uint32_t ptrId) {
  if (supported_ref_ptrs_.find(ptrId) != supported_ref_ptrs_.end()) return true;
  if (get_def_use_mgr()->WhileEachUser(ptrId, [this](Instruction* user) {
        auto dbg_op = user->GetCommonDebugOpcode();
        if (dbg_op == CommonDebugInfoDebugDeclare ||
            dbg_op == CommonDebugInfoDebugValue) {
          return true;
        }
        spv::Op op = user->opcode();
        if (IsNonPtrAccessChain(op) || op == spv::Op::OpCopyObject) {
          if (!HasOnlySupportedRefs(user->result_id())) {
            return false;
          }
        } else if (op != spv::Op::OpStore && op != spv::Op::OpLoad &&
                   op != spv::Op::OpName && !IsNonTypeDecorate(op)) {
          return false;
        }
        return true;
      })) {
    supported_ref_ptrs_.insert(ptrId);
    return true;
  }
  return false;
}